

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O2

void ImDrawList_AddLine(ImDrawList *self,ImVec2 a,ImVec2 b,ImU32 col,float thickness)

{
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_10 = b;
  local_8 = a;
  ImDrawList::AddLine(self,&local_8,&local_10,col,thickness);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddLine (ImDrawList *larg1, ImVec2 const *larg2, ImVec2 const *larg3, ImU32 *larg4, float larg5) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  ImVec2 arg3 ;
  ImU32 arg4 ;
  float arg5 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = larg5;
  try {
    ImDrawList_AddLine(arg1,arg2,arg3,arg4,arg5);
    
  } catch (...) {
    
  }
}